

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O3

bool renderKeyPresses(stStateUI *stateUI,TWaveform *waveform,TKeyPressCollection *keyPresses)

{
  pointer *ppsVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer psVar4;
  pointer psVar5;
  iterator __position;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 graph_size;
  ImVec2 graph_size_00;
  ImVec2 graph_size_01;
  ImVec2 graph_size_02;
  ImVec2 graph_size_03;
  byte bVar8;
  undefined8 uVar9;
  TKeyPressCollection *pTVar10;
  float *pfVar11;
  float *pfVar12;
  uint uVar13;
  bool bVar14;
  ImU32 IVar15;
  uint uVar16;
  uint uVar17;
  ImGuiIO *pIVar18;
  ImDrawList *pIVar19;
  const_iterator __position_00;
  pointer psVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  pointer psVar24;
  int iVar25;
  long lVar26;
  pointer __src;
  ulong uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  int *piVar32;
  int *piVar33;
  long lVar34;
  ImVec2 *pIVar35;
  uint __len;
  float fVar36;
  float fVar37;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar38;
  float fVar39;
  ImVec2 wsize;
  ImVec2 savePos;
  ImVec2 p1;
  ImVec2 p0;
  stWaveformView<short> tview;
  ImVec2 savePos2;
  stWaveformView<short> wview;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  int *local_140;
  ImVec4 local_138;
  float local_11c;
  undefined1 local_118 [16];
  int *local_108;
  undefined4 local_fc;
  undefined1 local_f8 [8];
  int64_t iStack_f0;
  long local_e8;
  TValueCC TStack_e0;
  undefined8 local_d8;
  TKey TStack_d0;
  undefined4 uStack_cc;
  TKeyPressCollection *local_c0;
  float local_b4;
  ImVec2 *local_b0;
  float *local_a8;
  float *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ImVec2 local_80;
  float local_74;
  float local_70;
  float local_6c;
  ImVec2 local_68;
  long local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  long local_38;
  
  piVar33 = &stateUI->nview;
  piVar32 = &stateUI->offset;
  iVar25 = stateUI->nview;
  if (iVar25 < 0) {
    iVar25 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
    *piVar33 = iVar25;
  }
  if (*piVar32 < 0) {
    *piVar32 = (int)(((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 1) - (long)iVar25 >>
                    1);
  }
  iVar21 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 1);
  if ((stateUI->scrolling == false & iVar25 < 0x80000 & stateUI->recording) == 1) {
    iVar25 = 0x80000;
    if (iVar21 < 0x80000) {
      iVar25 = iVar21;
    }
    *piVar33 = iVar25;
  }
  if (stateUI->lastSize != iVar21) {
    stateUI->viewMax = iVar21;
    stateUI->lastSize = iVar21;
    stateUI->nviewPrev = iVar25 + 1;
    if (stateUI->scrolling == false) {
      *piVar32 = iVar21 - iVar25;
    }
  }
  local_f8 = (undefined1  [8])((ulong)(uint)stateUI->windowHeightTitleBar << 0x20);
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_c0 = keyPresses;
  ImGui::SetNextWindowPos((ImVec2 *)local_f8,2,&local_40);
  local_f8._4_4_ = stateUI->windowHeightKeyPesses;
  if (((float)local_f8._4_4_ != 0.0) || (NAN((float)local_f8._4_4_))) {
    local_f8._0_4_ = (float)g_windowSizeX;
  }
  else {
    local_f8._4_4_ = 250.0;
    local_f8._0_4_ = (float)g_windowSizeX;
  }
  ImGui::SetNextWindowSize((ImVec2 *)local_f8,1);
  bVar14 = ImGui::Begin("Key Presses",(bool *)0x0,4);
  if (bVar14) {
    IVar6 = ImGui::GetContentRegionAvail();
    local_118._8_4_ = extraout_XMM0_Dc;
    local_118._0_4_ = IVar6.x;
    local_118._4_4_ = IVar6.y;
    local_118._12_4_ = extraout_XMM0_Dd;
    IVar6 = ImGui::GetContentRegionAvail();
    local_98 = IVar6.y;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    fVar36 = ImGui::GetTextLineHeightWithSpacing();
    local_158.y = fVar36 * -3.0 + local_98;
    local_158.x = (float)local_118._0_4_;
    iVar25 = stateUI->nview;
    local_140 = piVar33;
    local_108 = piVar32;
    if (iVar25 != stateUI->nviewPrev) {
      fVar36 = (float)iVar25 / (float)local_118._0_4_;
      if (fVar36 <= 1.0) {
        fVar36 = 1.0;
      }
      local_f8 = (undefined1  [8])
                 (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      iStack_f0 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)local_f8 >> 1;
      generateLowResWaveform<short>
                ((TWaveformViewT<short> *)local_f8,&stateUI->waveformLowRes,(int)fVar36);
      iVar25 = stateUI->nview;
      stateUI->nviewPrev = iVar25;
    }
    local_a8 = &stateUI->amin;
    local_a0 = &stateUI->amax;
    local_40 = (ImVec2)((stateUI->waveformLowRes).super__Vector_base<short,_std::allocator<short>_>.
                        _M_impl.super__Vector_impl_data._M_start + stateUI->offset);
    local_38 = (long)iVar25;
    pIVar18 = ImGui::GetIO();
    local_98 = (pIVar18->MousePos).x;
    local_b4 = (pIVar18->MousePos).y;
    local_150 = ImGui::GetCursorScreenPos();
    pIVar19 = ImGui::GetWindowDrawList();
    local_118._0_8_ = pIVar19;
    local_f8._0_4_ = 0.3;
    local_f8._4_4_ = 0.3;
    iStack_f0 = 0x3e99999a3e99999a;
    ImGui::PushStyleColor(7,(ImVec4 *)local_f8);
    local_f8._0_4_ = 1.0;
    local_f8._4_4_ = 1.0;
    iStack_f0 = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)local_f8);
    IVar6.y = local_158.y;
    IVar6.x = local_158.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveform,&local_40,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,IVar6);
    ImGui::PopStyleColor(2);
    ImGui::SetCursorScreenPos(&local_150);
    local_f8._0_4_ = 0.1;
    local_f8._4_4_ = 0.1;
    iStack_f0 = 0x3dcccccd;
    ImGui::PushStyleColor(7,(ImVec4 *)local_f8);
    local_f8._0_4_ = 1.0;
    local_f8._4_4_ = 1.0;
    iStack_f0 = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)local_f8);
    graph_size.y = local_158.y;
    graph_size.x = local_158.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveformInverse,&local_40,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,graph_size);
    ImGui::PopStyleColor(2);
    uVar22 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    psVar4 = (stateUI->waveformThreshold).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar33 = local_140;
    if ((uVar22 == (long)(stateUI->waveformThreshold).
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)psVar4) &&
       (psVar5 = (stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start,
       uVar22 == (long)(stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)psVar5)) {
      iStack_f0 = (int64_t)*local_140;
      local_f8 = (undefined1  [8])(psVar4 + *local_108);
      local_68 = (ImVec2)(psVar5 + *local_108);
      local_60 = iStack_f0;
      ImGui::SetCursorScreenPos(&local_150);
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 1.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      pfVar12 = local_a0;
      pfVar11 = local_a8;
      graph_size_00.y = local_158.y;
      graph_size_00.x = local_158.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveform,local_f8,*local_140,0,"",*local_a8,
                       *local_a0,graph_size_00);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_150);
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 1.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      graph_size_01.y = local_158.y;
      graph_size_01.x = local_158.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveformInverse,local_f8,*local_140,0,"",*pfVar11,
                       *pfVar12,graph_size_01);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_150);
      piVar33 = local_140;
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 0.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      graph_size_02.y = local_158.y;
      graph_size_02.x = local_158.x;
      ImGui::PlotLines("##WaveformMax",plotWaveform,&local_68,*piVar33,0,"",*pfVar11,*pfVar12,
                       graph_size_02);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_150);
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 0.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      uVar22 = (ulong)(uint)*piVar33;
      graph_size_03.y = local_158.y;
      graph_size_03.x = local_158.x;
      ImGui::PlotLines("##WaveformMax",plotWaveformInverse,&local_68,*piVar33,0,"",*pfVar11,*pfVar12
                       ,graph_size_03);
      ImGui::PopStyleColor(2);
    }
    ImGui::SetCursorScreenPos(&local_150);
    ImGui::InvisibleButton("##WaveformIB",&local_158);
    bVar14 = ImGui::IsItemHovered(0);
    local_fc = (undefined4)CONCAT71((int7)(uVar22 >> 8),1);
    if (bVar14) {
      pIVar18 = ImGui::GetIO();
      fVar36 = pIVar18->MouseWheel;
      iVar25 = stateUI->nview;
      iVar21 = (int)((float)iVar25 * ((fVar36 + 10.0) / 10.0));
      if (iVar21 < stateUI->viewMin) {
        iVar21 = stateUI->viewMin;
      }
      if (stateUI->viewMax < iVar21) {
        iVar21 = stateUI->viewMax;
      }
      stateUI->nview = iVar21;
      if ((fVar36 != 0.0) || (NAN(fVar36))) {
        fVar36 = (float)(iVar25 - iVar21) * ((local_98 - local_150.x) / local_158.x) +
                 (float)*local_108;
        if (fVar36 <= 0.0) {
          fVar36 = 0.0;
        }
        *local_108 = (int)fVar36;
      }
      bVar14 = ImGui::IsMouseDown(0);
      if ((bVar14) && (bVar14 = ImGui::IsMouseDragging(0,-1.0), !bVar14)) {
        stateUI->dragOffset = (float)stateUI->offset;
      }
      bVar14 = ImGui::IsMouseDragging(0,-1.0);
      if (bVar14) {
        local_11c = stateUI->dragOffset;
        IVar6 = ImGui::GetMouseDragDelta(0,-1.0);
        stateUI->offset = (int)(local_11c - ((float)stateUI->nview * IVar6.x) / local_158.x);
      }
      bVar14 = ImGui::IsMouseReleased(0);
      if (((bVar14) && (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)) ||
         (bVar14 = ImGui::IsMouseDoubleClicked(0), bVar14)) {
        lVar23 = (long)(((local_98 - local_150.x) * (float)*piVar33) / local_158.x +
                       (float)*local_108);
        __position_00._M_current =
             (local_c0->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
             ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        __position._M_current =
             (local_c0->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
             ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        uVar22 = ((long)__position._M_current - (long)__position_00._M_current >> 4) *
                 -0x5555555555555555;
        uVar30 = (uint)uVar22;
        if ((int)uVar30 < 1) {
          uVar17 = 0;
        }
        else {
          lVar28 = (long)(stateUI->params).keyPressWidth_samples;
          uVar27 = 0;
          do {
            lVar26 = (__position_00._M_current)->pos;
            lVar34 = lVar26 + (stateUI->params).offsetFromPeak_samples;
            lVar29 = lVar34 - lVar28;
            lVar34 = lVar34 + lVar28;
            lVar31 = lVar26;
            if (lVar29 < lVar26) {
              lVar31 = lVar29;
            }
            if (lVar34 < lVar31) {
              lVar31 = lVar34;
            }
            if (lVar23 < lVar31) {
              TStack_e0 = 0.0;
              local_d8._0_4_ = -1;
              local_d8._4_4_ = -1;
              TStack_d0 = 0x3f;
              local_f8 = (undefined1  [8])
                         (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              iStack_f0 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)local_f8 >> 1;
              local_e8 = lVar23;
              std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::insert
                        (&local_c0->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ,__position_00,(value_type *)local_f8);
              local_fc = 0;
              piVar33 = local_140;
              goto LAB_00136b13;
            }
            if (lVar29 < lVar26) {
              lVar29 = lVar26;
            }
            if (lVar29 <= lVar34) {
              lVar29 = lVar34;
            }
            if (lVar23 <= lVar29) goto LAB_00136a01;
            uVar27 = uVar27 + 1;
            __position_00._M_current = __position_00._M_current + 1;
          } while ((uVar30 & 0x7fffffff) != uVar27);
          uVar27 = uVar22 & 0xffffffff;
LAB_00136a01:
          uVar17 = (uint)uVar27;
          piVar33 = local_140;
        }
        if (uVar17 == uVar30) {
          TStack_e0 = 0.0;
          local_d8._0_4_ = -1;
          local_d8._4_4_ = -1;
          TStack_d0 = 0x3f;
          local_f8 = (undefined1  [8])
                     (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          iStack_f0 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)local_f8 >> 1;
          if (__position._M_current ==
              (local_c0->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_e8 = lVar23;
            std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
            _M_realloc_insert<stKeyPressData<short>const&>
                      ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)
                       local_c0,__position,(stKeyPressData<short> *)local_f8);
          }
          else {
            (__position._M_current)->cid = -1;
            (__position._M_current)->bind = -1;
            *(ulong *)&(__position._M_current)->predicted = CONCAT44(uStack_cc,0x3f);
            (__position._M_current)->pos = lVar23;
            (__position._M_current)->ccAvg = 0.0;
            ((__position._M_current)->waveform).samples = (short *)local_f8;
            ((__position._M_current)->waveform).n = iStack_f0;
            ppsVar1 = &(local_c0->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
            local_e8 = lVar23;
          }
          local_fc = 0;
        }
      }
    }
LAB_00136b13:
    bVar14 = ImGui::BeginPopupContextWindow((char *)0x0,1,true);
    if (bVar14) {
      ImGui::SliderInt("View  ",piVar33,stateUI->viewMin,stateUI->viewMax,"%d");
      ImGui::DragInt("Offset",local_108,(float)stateUI->nview * 0.01,0,
                     (int)((ulong)((long)(waveform->
                                         super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(waveform->super__Vector_base<short,_std::allocator<short>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 1) -
                     stateUI->nview,"%d");
      ImGui::SliderFloat("Amplitude Min",local_a8,-32000.0,0.0,"%.3f",1.0);
      ImGui::SliderFloat("Amplitude Max",local_a0,0.0,32000.0,"%.3f",1.0);
      ImGui::EndPopup();
    }
    local_f8._4_4_ = stateUI->scrollSize;
    local_f8._0_4_ = local_158.x;
    ImGui::InvisibleButton("##WaveformScrollIB",(ImVec2 *)local_f8);
    local_68.y = local_150.y + local_158.y;
    local_68.x = local_150.x;
    local_138.y = stateUI->scrollSize + local_150.y + local_158.y;
    local_138.x = local_158.x + local_150.x;
    local_f8._0_4_ = 1.0;
    local_f8._4_4_ = 1.0;
    iStack_f0 = 0x3f8000003f800000;
    IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
    uVar9 = local_118._0_8_;
    ImDrawList::AddRect((ImDrawList *)local_118._0_8_,&local_68,(ImVec2 *)&local_138,IVar15,0.0,0xf,
                        1.0);
    uVar2 = stateUI->nview;
    uVar3 = stateUI->offset;
    fVar36 = local_158.y + local_150.y;
    local_68.y = fVar36;
    local_68.x = (local_158.x * (float)(int)uVar3) / (float)stateUI->viewMax + local_150.x;
    local_138.y = stateUI->scrollSize + fVar36;
    local_138.x = (((float)(int)uVar3 + (float)(int)uVar2) * local_158.x) / (float)stateUI->viewMax
                  + local_150.x;
    local_f8._0_4_ = 1.0;
    local_f8._4_4_ = 1.0;
    iStack_f0 = 0x3f8000003f800000;
    IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
    ImDrawList::AddRectFilled((ImDrawList *)uVar9,&local_68,(ImVec2 *)&local_138,IVar15,0.0,0xf);
    local_68 = ImGui::GetCursorScreenPos();
    bVar14 = ImGui::IsItemHovered(0);
    if ((bVar14) && (bVar14 = ImGui::IsMouseDown(0), bVar14)) {
      stateUI->scrolling = true;
    }
    piVar33 = local_108;
    if (stateUI->scrolling == true) {
      stateUI->offset =
           (int)((float)stateUI->viewMax * ((local_98 - local_150.x) / local_158.x) -
                (float)(stateUI->nview / 2));
    }
    bVar14 = ImGui::IsMouseDown(0);
    pTVar10 = local_c0;
    if (!bVar14) {
      stateUI->scrolling = false;
    }
    iVar21 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1) - *local_140;
    iVar25 = *piVar33;
    if (iVar25 <= iVar21) {
      iVar21 = iVar25;
    }
    iVar25 = 0;
    if (0 < iVar21) {
      iVar25 = iVar21;
    }
    *piVar33 = iVar25;
    psVar20 = (local_c0->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    psVar24 = (local_c0->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_b0 = (ImVec2 *)waveform;
    if (0 < (int)((ulong)((long)psVar24 - (long)psVar20) >> 4) * -0x55555555) {
      uVar30 = 0;
      piVar32 = local_108;
      piVar33 = local_140;
      do {
        lVar23 = (long)(stateUI->params).offsetFromPeak_samples + psVar20[(int)uVar30].pos;
        lVar28 = (long)(stateUI->params).keyPressWidth_samples;
        iVar25 = stateUI->offset;
        if ((long)iVar25 <= lVar23 + lVar28) {
          if ((long)(*piVar33 + iVar25) <= lVar23 - lVar28) {
            iVar25 = (int)((ulong)((long)psVar24 - (long)psVar20) >> 4) * -0x55555555;
            break;
          }
          local_138.x = ((float)(psVar20[(int)uVar30].pos - (long)iVar25) / (float)*piVar33) *
                        local_158.x + local_150.x;
          local_138.y = local_150.y;
          local_148.y = local_150.y + local_158.y;
          local_148.x = local_138.x;
          local_f8._0_4_ = 1.0;
          local_f8._4_4_ = 0.0;
          iStack_f0 = 0x3f4ccccd00000000;
          IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
          ImDrawList::AddLine((ImDrawList *)local_118._0_8_,(ImVec2 *)&local_138,&local_148,IVar15,
                              1.0);
          lVar23 = (pTVar10->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar30].pos;
          lVar34 = (long)stateUI->offset;
          lVar26 = (stateUI->params).offsetFromPeak_samples + lVar23;
          fVar36 = (float)stateUI->nview;
          lVar28 = (long)(stateUI->params).keyPressWidth_samples;
          fVar38 = (float)(lVar26 - (lVar28 + lVar34)) / fVar36;
          fVar39 = (float)((lVar28 - lVar34) + lVar26) / fVar36;
          fVar37 = ((float)(lVar23 - lVar34) / fVar36) * local_158.x + local_150.x;
          local_a0 = (float *)CONCAT44(local_a0._4_4_,fVar38);
          local_138.x = fVar38 * local_158.x + local_150.x;
          local_138.y = local_150.y;
          local_a8 = (float *)CONCAT44(local_a8._4_4_,fVar39);
          local_148.x = local_158.x * fVar39 + local_150.x;
          local_148.y = local_158.y + local_150.y;
          fVar36 = local_138.x;
          if (fVar37 <= local_138.x) {
            fVar36 = fVar37;
          }
          fVar38 = local_148.x;
          if (fVar36 <= local_148.x) {
            fVar38 = fVar36;
          }
          if (local_98 <= fVar38) {
LAB_00137078:
            local_f8._0_4_ = 1.0;
            local_f8._4_4_ = 0.0;
            iStack_f0 = 0x3e99999a00000000;
            IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
            pIVar19 = (ImDrawList *)local_118._0_8_;
            ImDrawList::AddRectFilled
                      ((ImDrawList *)local_118._0_8_,(ImVec2 *)&local_138,&local_148,IVar15,0.0,0xf)
            ;
          }
          else {
            fVar36 = local_138.x;
            if (local_138.x <= fVar37) {
              fVar36 = fVar37;
            }
            fVar37 = local_148.x;
            if (local_148.x <= fVar36) {
              fVar37 = fVar36;
            }
            if ((fVar37 <= local_98) || (local_b4 <= local_150.y)) goto LAB_00137078;
            local_f8._0_4_ = 1.0;
            local_f8._4_4_ = 0.0;
            iStack_f0 = (ulong)*(uint *)(&DAT_0019f260 + (ulong)(local_b4 < local_148.y) * 4) <<
                        0x20;
            local_11c = local_148.y;
            IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)local_118._0_8_,(ImVec2 *)&local_138,&local_148,IVar15,0.0,0xf)
            ;
            if (local_11c <= local_b4) {
LAB_00137071:
              pIVar19 = (ImDrawList *)local_118._0_8_;
            }
            else {
              bVar14 = ImGui::IsMouseReleased(0);
              if ((bVar14) && (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)) {
                bVar8 = (byte)local_fc;
              }
              else {
                bVar14 = ImGui::IsMouseDoubleClicked(0);
                bVar8 = (byte)local_fc & bVar14;
              }
              if (bVar8 == 0) goto LAB_00137071;
              psVar24 = (pTVar10->
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ).
                        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar20 = (pTVar10->
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ).
                        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              __src = psVar24 + (long)(int)uVar30 + 1;
              if (__src != psVar20) {
                memmove(psVar24 + (int)uVar30,__src,(long)psVar20 - (long)__src);
                psVar20 = (pTVar10->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              (pTVar10->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
              ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = psVar20 + -1;
              uVar30 = uVar30 - 1;
              pIVar19 = (ImDrawList *)local_118._0_8_;
            }
          }
          uVar17 = *piVar33;
          if ((float)(int)uVar17 < local_158.x * 64.0) {
            local_11c = local_158.x;
            uVar17 = -uVar30;
            if (0 < (int)uVar30) {
              uVar17 = uVar30;
            }
            __len = 1;
            if (9 < uVar17) {
              uVar22 = (ulong)uVar17;
              uVar13 = 4;
              do {
                __len = uVar13;
                uVar16 = (uint)uVar22;
                if (uVar16 < 100) {
                  __len = __len - 2;
                  goto LAB_0013718a;
                }
                if (uVar16 < 1000) {
                  __len = __len - 1;
                  goto LAB_0013718a;
                }
                if (uVar16 < 10000) goto LAB_0013718a;
                uVar22 = uVar22 / 10000;
                uVar13 = __len + 4;
              } while (99999 < uVar16);
              __len = __len + 1;
            }
LAB_0013718a:
            local_6c = local_150.x;
            local_f8 = (undefined1  [8])&local_e8;
            std::__cxx11::string::_M_construct
                      ((ulong)local_f8,(char)__len - (char)((int)uVar30 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar30 >> 0x1f) + (long)local_f8),__len,uVar17);
            IVar6 = ImGui::CalcTextSize((char *)local_f8,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc_00;
            local_58._0_4_ = IVar6.x;
            local_58._4_4_ = IVar6.y;
            local_58._12_4_ = extraout_XMM0_Dd_00;
            local_70 = local_150.y;
            local_74 = local_158.y;
            fVar36 = ImGui::GetTextLineHeightWithSpacing();
            local_80.y = (local_70 + local_74) - fVar36;
            local_80.x = ((local_a0._0_4_ + local_a8._0_4_) * local_11c - (float)local_58._0_4_) *
                         0.5 + local_6c;
            ImGui::SetCursorScreenPos(&local_80);
            piVar32 = local_108;
            piVar33 = local_140;
            pIVar19 = (ImDrawList *)local_118._0_8_;
            if (local_f8 != (undefined1  [8])&local_e8) {
              operator_delete((void *)local_f8,local_e8 + 1);
            }
            ImGui::Text("%d",(ulong)uVar30);
            uVar17 = *piVar33;
          }
          local_138.x = ((float)((g_playbackData.idx + g_playbackData.offset) - (long)*piVar32) /
                        (float)(int)uVar17) * local_158.x + local_150.x;
          local_138.y = local_150.y;
          local_148.y = local_150.y + local_158.y;
          local_148.x = local_138.x;
          local_f8._0_4_ = 1.0;
          local_f8._4_4_ = 1.0;
          iStack_f0 = 0x3e99999a00000000;
          IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
          ImDrawList::AddLine(pIVar19,(ImVec2 *)&local_138,&local_148,IVar15,1.0);
          psVar20 = (pTVar10->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar24 = (pTVar10->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar30 = uVar30 + 1;
        iVar21 = (int)((ulong)((long)psVar24 - (long)psVar20) >> 4);
        iVar25 = iVar21 * -0x55555555;
      } while (SBORROW4(uVar30,iVar25) != (int)(uVar30 + iVar21 * 0x55555555) < 0);
      uVar9 = local_118._0_8_;
      if (0 < iVar25) {
        lVar28 = 0x10;
        lVar23 = 0;
        do {
          local_138.x = ((float)*(long *)((long)&(psVar20->waveform).samples + lVar28) /
                        (float)stateUI->viewMax) * local_158.x + local_150.x;
          local_138.y = local_150.y + local_158.y;
          local_148.y = local_150.y + local_158.y + stateUI->scrollSize;
          local_148.x = local_138.x;
          local_f8._0_4_ = 1.0;
          local_f8._4_4_ = 0.0;
          iStack_f0 = 0x3e99999a00000000;
          IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
          ImDrawList::AddLine((ImDrawList *)uVar9,(ImVec2 *)&local_138,&local_148,IVar15,1.0);
          lVar23 = lVar23 + 1;
          psVar20 = (pTVar10->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar28 = lVar28 + 0x30;
        } while (lVar23 < (int)((ulong)((long)(pTVar10->
                                              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                              ).
                                              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)psVar20) >> 4) * -0x55555555);
      }
    }
    ImGui::SetCursorScreenPos(&local_68);
    ImGui::PushItemWidth(100.0);
    pTVar10 = local_c0;
    if (stateUI->recording == false) {
      if (stateUI->audioCapture == true) {
        local_f8._0_4_ = 0.0;
        local_f8._4_4_ = 0.0;
        bVar14 = ImGui::Button("   Record",(ImVec2 *)local_f8);
        if ((bVar14) &&
           ((ulong)((long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>.
                         _M_impl.super__Vector_impl_data._M_start) < 0x57e400)) {
          AudioLogger::resume(&audioLogger);
          stateUI->recording = true;
          LOCK();
          g_doRecord._M_base._M_i = (__atomic_base<bool>)true;
          UNLOCK();
        }
        local_138._0_8_ = ImGui::GetCursorScreenPos();
        local_118._8_4_ = extraout_XMM0_Dc_02;
        local_118._0_4_ = local_138.x;
        local_118._4_4_ = local_138.y;
        local_118._12_4_ = extraout_XMM0_Dd_02;
        IVar6 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
        local_148.x = IVar6.x * 0.9 + (float)local_118._0_4_;
        fVar36 = ImGui::GetFrameHeightWithSpacing();
        local_148.y = fVar36 * -0.56 + (float)local_118._4_4_;
        pIVar19 = ImGui::GetWindowDrawList();
        local_f8._0_4_ = 1.0;
        local_f8._4_4_ = 0.0;
        iStack_f0 = 0x3f80000000000000;
        IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
        ImDrawList::AddCircleFilled(pIVar19,&local_148,6.0,IVar15,0xc);
        ImGui::SetCursorScreenPos((ImVec2 *)&local_138);
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::Checkbox("x0.5",&renderKeyPresses::playHalfSpeed);
      ImGui::SameLine(0.0,-1.0);
      if (g_playbackData.playing == true) {
        local_f8._0_4_ = 0.0;
        local_f8._4_4_ = 0.0;
        bVar14 = ImGui::Button("Stop",(ImVec2 *)local_f8);
        pIVar35 = local_b0;
        if ((bVar14) ||
           ((bVar14 = ImGui::IsKeyPressed(0x2c,true), bVar14 &&
            (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)))) {
          g_playbackData.playing = false;
          g_playbackData.idx = g_playbackData.waveform.n + -0x400;
        }
      }
      else {
        local_f8._0_4_ = 0.0;
        local_f8._4_4_ = 0.0;
        bVar14 = ImGui::Button("Play",(ImVec2 *)local_f8);
        pIVar35 = local_b0;
        piVar32 = local_108;
        piVar33 = local_140;
        if ((bVar14) ||
           ((bVar14 = ImGui::IsKeyPressed(0x2c,true), piVar32 = local_108, piVar33 = local_140,
            bVar14 && (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)))) {
          g_playbackData.playing = true;
          g_playbackData.slowDown = renderKeyPresses::playHalfSpeed + 1;
          g_playbackData.idx = 0;
          g_playbackData.offset = (int64_t)*piVar32;
          uVar30 = 160000;
          if (*piVar33 < 160000) {
            uVar30 = *piVar33;
          }
          g_playbackData.waveform.samples = (short *)(g_playbackData.offset * 2 + (long)*pIVar35);
          g_playbackData.waveform.n = (int64_t)(int)uVar30;
          SDL_PauseAudioDevice(g_deviceIdOut,0);
        }
      }
      if (g_playbackData.waveform.n + -0x200 <= g_playbackData.idx) {
        g_playbackData.playing = false;
        SDL_ClearQueuedAudio(g_deviceIdOut);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
      }
      ImGui::SameLine(0.0,-1.0);
      bVar14 = ImGui::SliderFloat("Threshold background",&renderKeyPresses::thresholdBackground,0.1,
                                  50.0,"%.3f",1.0);
      if (bVar14) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar14 = ImGui::SliderInt("History Size",&renderKeyPresses::historySizeReset,0x200,0x4000,"%d"
                               );
      if (bVar14) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      local_f8._0_4_ = 0.0;
      local_f8._4_4_ = 0.0;
      bVar14 = ImGui::Button("Recalculate",(ImVec2 *)local_f8);
      if (bVar14) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Key width",&(stateUI->params).keyPressWidth_samples,8.0,0,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Peak offset",&(stateUI->params).offsetFromPeak_samples,8.0,-0x640,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Align window",&(stateUI->params).alignWindow_samples,8.0,0,0x640,"%d");
      ImGui::PopItemWidth();
    }
    else {
      if (((byte)g_doRecord._M_base._M_i & 1) != 0) {
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        AudioLogger::record(&audioLogger,0.2,0);
      }
      local_f8._0_4_ = 0.0;
      local_f8._4_4_ = 0.0;
      bVar14 = ImGui::Button("   Stop Recording",(ImVec2 *)local_f8);
      if (bVar14) {
        AudioLogger::pause(&audioLogger);
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        stateUI->recalculateKeyPresses = true;
        stateUI->lastSize = stateUI->lastSize + -1;
        stateUI->recording = false;
        stateUI->findBestCutoffFreq = true;
        stateUI->rescaleWaveform = true;
      }
      local_138._0_8_ = ImGui::GetCursorScreenPos();
      local_118._8_4_ = extraout_XMM0_Dc_01;
      local_118._0_4_ = local_138.x;
      local_118._4_4_ = local_138.y;
      local_118._12_4_ = extraout_XMM0_Dd_01;
      IVar6 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
      local_148.x = IVar6.x * 0.9 + (float)local_118._0_4_;
      fVar36 = ImGui::GetFrameHeightWithSpacing();
      fVar36 = fVar36 * -0.56 + (float)local_118._4_4_;
      IVar7.y = fVar36 + -4.0;
      IVar7.x = local_148.x + -4.0;
      local_80.y = fVar36 + 4.0;
      local_80.x = local_148.x + 4.0;
      local_148 = IVar7;
      pIVar19 = ImGui::GetWindowDrawList();
      local_f8._0_4_ = 1.0;
      local_f8._4_4_ = 1.0;
      iStack_f0 = 0x3f8000003f800000;
      IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_f8);
      ImDrawList::AddRectFilled(pIVar19,&local_148,&local_80,IVar15,0.0,0xf);
      ImGui::SetCursorScreenPos((ImVec2 *)&local_138);
      ImGui::SameLine(0.0,-1.0);
      pIVar35 = local_b0;
      ImGui::Text("Record length: %4.2f s (max : %4.2f s)",
                  SUB84((double)((float)(ulong)((long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 1) /
                                16000.0),0),0);
    }
    if (stateUI->recalculateKeyPresses == true) {
      local_f8 = *(undefined1 (*) [8])pIVar35;
      iStack_f0 = (long)pIVar35[1] - (long)local_f8 >> 1;
      findKeyPresses<short>
                ((TWaveformViewT<short> *)local_f8,pTVar10,&stateUI->waveformThreshold,
                 &stateUI->waveformMax,(double)renderKeyPresses::thresholdBackground,0x200,
                 renderKeyPresses::historySizeReset,true);
      stateUI->recalculateKeyPresses = false;
    }
    fVar36 = ImGui::GetWindowHeight();
  }
  else {
    fVar36 = ImGui::GetTextLineHeightWithSpacing();
  }
  stateUI->windowHeightKeyPesses = fVar36;
  ImGui::End();
  return false;
}

Assistant:

bool renderKeyPresses(stStateUI & stateUI, const TWaveform & waveform, TKeyPressCollection & keyPresses) {
    auto & params = stateUI.params;

    bool & scrolling = stateUI.scrolling;
    bool & recalculateKeyPresses = stateUI.recalculateKeyPresses;

    int & nview = stateUI.nview;
    int & viewMin = stateUI.viewMin;
    int & viewMax = stateUI.viewMax;
    int & offset = stateUI.offset;
    int & lastSize = stateUI.lastSize;
    int & lastKeyPresses = stateUI.lastKeyPresses;

    float & amin = stateUI.amin;
    float & amax = stateUI.amax;

    float & dragOffset = stateUI.dragOffset;
    float & scrollSize = stateUI.scrollSize;

    auto & nviewPrev = stateUI.nviewPrev;

    TWaveform & waveformLowRes = stateUI.waveformLowRes;
    TWaveform & waveformThreshold = stateUI.waveformThreshold;
    TWaveform & waveformMax = stateUI.waveformMax;

    if (nview < 0) nview = waveform.size();
    if (offset < 0) offset = (waveform.size() - nview)/2;

    if (stateUI.recording) {
        if (nview < 1024*kSamplesPerFrame && scrolling == false) {
            nview = std::min((int) (1024*kSamplesPerFrame), (int) waveform.size());
        }
    }

    if (lastSize != (int) waveform.size()) {
        viewMax = waveform.size();
        lastSize = waveform.size();
        nviewPrev = nview + 1;

        if (scrolling == false) {
            offset = waveform.size() - nview;
        }
    }

#if 0
    if ((int) keyPresses.size() >= lastKeyPresses + 10) {
        lastKeyPresses = keyPresses.size();

        stateUI.similarityMap.clear();
        stateUI.flags.recalculateSimilarityMap = true;
        stateUI.doUpdate = true;
    }
#endif

    ImGui::SetNextWindowPos(ImVec2(0, stateUI.windowHeightTitleBar), ImGuiCond_Once);
    if (stateUI.windowHeightKeyPesses == 0.0f) {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, 250.0f), ImGuiCond_Always);
    } else {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, stateUI.windowHeightKeyPesses), ImGuiCond_Always);
    }
    if (ImGui::Begin("Key Presses", nullptr, ImGuiWindowFlags_NoMove)) {
        bool ignoreDelete = false;

        auto wsize = ImVec2(ImGui::GetContentRegionAvailWidth(), ImGui::GetContentRegionAvail().y - 3*ImGui::GetTextLineHeightWithSpacing());

        if (nview != nviewPrev) {
            generateLowResWaveform(waveform, waveformLowRes, std::max(1.0f, nview/wsize.x));
            nviewPrev = nview;
        }

        auto wview = getView(waveformLowRes, offset, nview);

        auto mpos = ImGui::GetIO().MousePos;
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.3f, 0.3f, 0.3f, 0.3f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveform, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);
        ImGui::SetCursorScreenPos(savePos);
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.1f, 0.1f, 0.1f, 0.0f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveformInverse, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);

        if (waveform.size() == waveformThreshold.size() && waveform.size() == waveformMax.size()) {
            auto tview = getView(waveformThreshold, offset, nview);
            auto mview = getView(waveformMax, offset, nview);

            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveform, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveformInverse, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveform, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveformInverse, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
        }
        ImGui::SetCursorScreenPos(savePos);

        ImGui::InvisibleButton("##WaveformIB",wsize);
        if (ImGui::IsItemHovered()) {
            auto w = ImGui::GetIO().MouseWheel;
            auto nview_old = nview;
            nview *= (10.0 + w)/10.0;
            nview = std::min(std::max(viewMin, nview), viewMax);
            if (w != 0.0) {
                offset = std::max(0.0f, offset + ((mpos.x - savePos.x)/wsize.x)*(nview_old - nview));
            }

            if (ImGui::IsMouseDown(0) && ImGui::IsMouseDragging(0) == false) {
                dragOffset = offset;
            }

            if (ImGui::IsMouseDragging(0)) {
                offset = dragOffset - ImGui::GetMouseDragDelta(0).x*nview/wsize.x;
            }

            if ((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) {
                int i = 0;
                int64_t pos = offset + nview*(mpos.x - savePos.x)/wsize.x;
                for (i = 0; i < (int) keyPresses.size(); ++i) {
                    int64_t p0 = keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples;
                    int64_t p1 = keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples;
                    int64_t pmin = std::min(std::min(keyPresses[i].pos, p0), p1);
                    int64_t pmax = std::max(std::max(keyPresses[i].pos, p0), p1);
                    if (pmin > pos) {
                        ignoreDelete = true;
                        TKeyPressData entry;
                        entry.pos = pos;
                        entry.waveform = getView(waveform, 0);
                        keyPresses.insert(keyPresses.begin() + i, entry);
                        break;
                    }
                    if (pos >= pmin && pos <= pmax) break;
                }
                if (i == (int) keyPresses.size() && ignoreDelete == false) {
                    ignoreDelete = true;
                    TKeyPressData entry;
                    entry.pos = pos;
                    entry.waveform = getView(waveform, 0);
                    keyPresses.push_back(entry);
                }
            }
        }
        if (ImGui::BeginPopupContextWindow()) {
            ImGui::SliderInt("View  ", &nview, viewMin, viewMax);
            ImGui::DragInt  ("Offset", &offset, 0.01*nview, 0, waveform.size() - nview);
            ImGui::SliderFloat("Amplitude Min", &amin, -32000, 0);
            ImGui::SliderFloat("Amplitude Max", &amax, 0, 32000);
            ImGui::EndPopup();
        }

        ImGui::InvisibleButton("##WaveformScrollIB", {wsize.x, scrollSize});
        drawList->AddRect({savePos.x, savePos.y + wsize.y}, {savePos.x + wsize.x, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));
        drawList->AddRectFilled({savePos.x + wsize.x*(1.f*offset)/viewMax, savePos.y + wsize.y}, {savePos.x + wsize.x*(1.f*offset + nview)/viewMax, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));

        auto savePos2 = ImGui::GetCursorScreenPos();

        if (ImGui::IsItemHovered()) {
            if (ImGui::IsMouseDown(0)) {
                scrolling = true;
            }
        }

        if (scrolling) {
            offset = ((mpos.x - savePos.x)/wsize.x)*viewMax - nview/2;
        }

        if (ImGui::IsMouseDown(0) == false) {
            scrolling = false;
        }

        offset = std::max(0, std::min((int) offset, (int) waveform.size() - nview));
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            if (keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples < offset) continue;
            if (keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples >= offset + nview) break;

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.8f }), 1.0f);
            }

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;
                float x1 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples - offset))/nview;
                float x2 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x1*wsize.x, savePos.y };
                ImVec2 p2 = { savePos.x + x2*wsize.x, savePos.y + wsize.y };

                float xmin = std::min(std::min(p0.x, p1.x), p2.x);
                float xmax = std::max(std::max(p0.x, p1.x), p2.x);

                bool isHovered = (mpos.x > xmin && mpos.x < xmax && mpos.y > p1.y && mpos.y < p2.y);

                float col = isHovered ? 0.7f : 0.3f;
                drawList->AddRectFilled(p1, p2, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, col }));

                if (isHovered) {
                    if (((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) && ignoreDelete == false) {
                        keyPresses.erase(keyPresses.begin() + i);
                        --i;
                    }
                }

                if (nview < 64.0*wsize.x) {
                    ImGui::SetCursorScreenPos({ savePos.x + 0.5f*((x1 + x2)*wsize.x - ImGui::CalcTextSize(std::to_string(i).c_str()).x), savePos.y + wsize.y - ImGui::GetTextLineHeightWithSpacing() });
                    ImGui::Text("%d", i);
                }

            }

            {
                float x0 = ((float)(g_playbackData.offset + g_playbackData.idx - offset))/nview;

                ImVec2 p0 = {savePos.x + x0*wsize.x, savePos.y};
                ImVec2 p1 = {savePos.x + x0*wsize.x, savePos.y + wsize.y};
                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 0.0f, 0.3f }));
            }
        }
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            {
                float x0 = ((float)(keyPresses[i].pos))/viewMax;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y + scrollSize };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.3f }));
            }
        }

        ImGui::SetCursorScreenPos(savePos2);

        //auto io = ImGui::GetIO();
        //ImGui::Text("Keys pressed:");   for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); i++) if (ImGui::IsKeyPressed(i))             { ImGui::SameLine(); ImGui::Text("%d", i); }

        static bool playHalfSpeed = false;
        static int historySizeReset = kFindKeysHistorySizeReset;
        static float thresholdBackground = kFindKeysThreshold;
        ImGui::PushItemWidth(100.0);

        if (stateUI.recording == false) {
            if (stateUI.audioCapture) {
                if (ImGui::Button("   Record")) {
                    if (float(stateUI.waveformInput.size()/kSampleRate) < kMaxRecordSize_s) {
                        audioLogger.resume();
                        stateUI.recording = true;
                        g_doRecord = true;
                    }
                }
                {
                    auto savePos = ImGui::GetCursorScreenPos();
                    auto p = savePos;
                    p.x += 0.90f*ImGui::CalcTextSize("  ").x;
                    p.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();
                    ImGui::GetWindowDrawList()->AddCircleFilled(p, 6.0, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 1.0f }));
                    ImGui::SetCursorScreenPos(savePos);
                }

                ImGui::SameLine();
            }

            ImGui::Checkbox("x0.5", &playHalfSpeed);
            ImGui::SameLine();
            if (g_playbackData.playing) {
                if (ImGui::Button("Stop") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = false;
                    g_playbackData.idx = g_playbackData.waveform.n - TPlaybackData::kSamples;
                }
            } else {
                if (ImGui::Button("Play") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = true;
                    g_playbackData.slowDown = playHalfSpeed ? 2 : 1;
                    g_playbackData.idx = 0;
                    g_playbackData.offset = offset;
                    g_playbackData.waveform = getView(waveform, offset, std::min((int) (10*kSampleRate), nview));
                    SDL_PauseAudioDevice(g_deviceIdOut, 0);
                }
            }

            if (g_playbackData.idx >= g_playbackData.waveform.n - kSamplesPerFrame) {
                g_playbackData.playing = false;
                SDL_ClearQueuedAudio(g_deviceIdOut);
#ifndef __EMSCRIPTEN__
                SDL_PauseAudioDevice(g_deviceIdOut, 1);
#endif
            }

            ImGui::SameLine();
            ImGui::SliderFloat("Threshold background", &thresholdBackground, 0.1f, 50.0f) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            ImGui::SliderInt("History Size", &historySizeReset, 512, 1024*16) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            if (ImGui::Button("Recalculate")) {
                recalculateKeyPresses = true;
            }

            ImGui::SameLine();
            ImGui::DragInt("Key width", &params.keyPressWidth_samples, 8, 0, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Peak offset", &params.offsetFromPeak_samples, 8, -kSampleRate/10, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Align window", &params.alignWindow_samples, 8, 0, kSampleRate/10);

            ImGui::PopItemWidth();
        } else {
            if (g_doRecord) {
                g_doRecord = false;
                audioLogger.record(0.2f, 0);
            }

            if (ImGui::Button("   Stop Recording")) {
                audioLogger.pause();
                g_doRecord = false;

                stateUI.recalculateKeyPresses = true;
                stateUI.lastSize = stateUI.lastSize - 1;
                stateUI.recording = false;
                stateUI.findBestCutoffFreq = true;
                stateUI.rescaleWaveform = true;
            }
            {
                auto savePos = ImGui::GetCursorScreenPos();
                auto p0 = savePos;
                p0.x += 0.90f*ImGui::CalcTextSize("  ").x;
                p0.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();

                auto p1 = p0;
                p0.x -= 4.0f;
                p0.y -= 4.0f;
                p1.x += 4.0f;
                p1.y += 4.0f;

                ImGui::GetWindowDrawList()->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 1.0f, 1.0f }));
                ImGui::SetCursorScreenPos(savePos);
            }

            ImGui::SameLine();
            ImGui::Text("Record length: %4.2f s (max : %4.2f s)", (float)(stateUI.waveformInput.size())/kSampleRate, kMaxRecordSize_s);
        }

        if (recalculateKeyPresses) {
            findKeyPresses(getView(waveform, 0), keyPresses, waveformThreshold, waveformMax, thresholdBackground, kFindKeysHistorySize, historySizeReset, kFindKeysRemoveLowPower);
            recalculateKeyPresses = false;
        }

        stateUI.windowHeightKeyPesses = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightKeyPesses = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();

    return false;
}